

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
callable_impl<void,_cppcms::impl::cgi::fastcgi::io_handler_to_event_handler>::callable_impl
          (callable_impl<void,_cppcms::impl::cgi::fastcgi::io_handler_to_event_handler> *this,
          io_handler_to_event_handler *f)

{
  callable<void_(const_std::error_code_&,_unsigned_long)>::callable(&this->super_callable_type);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__callable_impl_002b8938;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&this->func,
             (intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)f);
  return;
}

Assistant:

callable_impl(F f) : func(f){}